

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

ElementDocument * __thiscall Rml::Context::GetDocument(Context *this,String *id)

{
  __type _Var1;
  int iVar2;
  pointer pEVar3;
  Element *this_00;
  ElementDocument *this_01;
  String *__lhs;
  ElementDocument *document;
  int i;
  String *id_local;
  Context *this_local;
  
  document._4_4_ = 0;
  do {
    pEVar3 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->(&this->root);
    iVar2 = Element::GetNumChildren(pEVar3,false);
    if (iVar2 <= document._4_4_) {
      return (ElementDocument *)0x0;
    }
    pEVar3 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->(&this->root);
    this_00 = Element::GetChild(pEVar3,document._4_4_);
    this_01 = Element::GetOwnerDocument(this_00);
    if (this_01 != (ElementDocument *)0x0) {
      __lhs = Element::GetId_abi_cxx11_(&this_01->super_Element);
      _Var1 = ::std::operator==(__lhs,id);
      if (_Var1) {
        return this_01;
      }
    }
    document._4_4_ = document._4_4_ + 1;
  } while( true );
}

Assistant:

ElementDocument* Context::GetDocument(const String& id)
{
	for (int i = 0; i < root->GetNumChildren(); i++)
	{
		ElementDocument* document = root->GetChild(i)->GetOwnerDocument();
		if (document == nullptr)
			continue;

		if (document->GetId() == id)
			return document;
	}

	return nullptr;
}